

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::Make<duckdb::PhysicalCreateSecret,duckdb::CreateSecretInput&,unsigned_long&>
          (PhysicalPlan *this,CreateSecretInput *args,unsigned_long *args_1)

{
  PhysicalCreateSecret *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_108;
  CreateSecretInput local_100;
  
  this_00 = (PhysicalCreateSecret *)ArenaAllocator::AllocateAligned(&this->arena,0x158);
  CreateSecretInput::CreateSecretInput(&local_100,args);
  PhysicalCreateSecret::PhysicalCreateSecret(this_00,&local_100,*args_1);
  CreateSecretInput::~CreateSecretInput(&local_100);
  local_108._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_108);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}